

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

bool __thiscall ON_Interval::Union(ON_Interval *this,int count,double *t)

{
  double dVar1;
  bool bVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (count < 1 || t == (double *)0x0) {
LAB_0056ff4b:
    if (0 < count && t != (double *)0x0) {
      dVar7 = this->m_t[0];
      dVar1 = this->m_t[1];
      bVar2 = dVar7 == -1.23432101234321e+308;
      dVar5 = dVar1;
      if (bVar2 && dVar1 == -1.23432101234321e+308) {
        dVar7 = *t;
        t = t + 1;
        this->m_t[0] = dVar7;
        this->m_t[1] = dVar7;
        count = count + -1;
        dVar5 = dVar7;
      }
      dVar6 = EmptyInterval.m_t[1];
      if (dVar7 <= dVar5) {
        dVar8 = dVar7;
        dVar4 = dVar7;
        if (dVar7 < dVar5) {
          dVar8 = dVar5;
        }
      }
      else {
        dVar4 = (double)(~-(ulong)(dVar7 < dVar5) & (ulong)dVar5 |
                        -(ulong)(dVar7 < dVar5) & (ulong)ON_DBL_QNAN);
        dVar8 = ON_DBL_QNAN;
        if (!NAN(dVar7) && !NAN(dVar5)) {
          dVar8 = (double)(~-(ulong)(dVar5 <= dVar7) & (ulong)dVar5 |
                          (ulong)dVar7 & -(ulong)(dVar5 <= dVar7));
        }
      }
      if (count != 0) {
        uVar3 = count + 1;
        dVar7 = dVar8;
        do {
          dVar8 = *t;
          dVar5 = dVar4;
          if (((1.23432101234321e+308 <= ABS(dVar8)) || (dVar5 = dVar8, dVar8 < dVar4)) ||
             (dVar5 = dVar4, dVar8 <= dVar7)) {
            dVar8 = dVar7;
            dVar4 = dVar5;
          }
          t = t + 1;
          uVar3 = uVar3 - 1;
          dVar7 = dVar8;
        } while (1 < uVar3);
      }
      if (((dVar4 <= dVar8) && (ABS(dVar4) < 1.23432101234321e+308)) &&
         (ABS(dVar8) < 1.23432101234321e+308)) {
        this->m_t[0] = dVar4;
        this->m_t[1] = dVar8;
        return true;
      }
      this->m_t[0] = EmptyInterval.m_t[0];
      this->m_t[1] = dVar6;
      return bVar2 && dVar1 == -1.23432101234321e+308;
    }
  }
  else {
    do {
      if (ABS(*t) < 1.23432101234321e+308) goto LAB_0056ff4b;
      t = t + 1;
      bVar2 = 1 < count;
      count = count + -1;
    } while (bVar2);
  }
  dVar7 = this->m_t[0];
  dVar1 = this->m_t[1];
  if (((dVar7 == -1.23432101234321e+308) && (!NAN(dVar7))) &&
     ((dVar1 == -1.23432101234321e+308 && (!NAN(dVar1))))) {
    return false;
  }
  if (dVar7 <= dVar1) {
    dVar5 = dVar7;
    dVar6 = dVar7;
    if (dVar7 < dVar1) {
      dVar5 = dVar1;
    }
  }
  else {
    dVar6 = (double)(~-(ulong)(dVar7 < dVar1) & (ulong)dVar1 |
                    -(ulong)(dVar7 < dVar1) & (ulong)ON_DBL_QNAN);
    dVar5 = ON_DBL_QNAN;
    if (!NAN(dVar7) && !NAN(dVar1)) {
      dVar5 = (double)(~-(ulong)(dVar1 <= dVar7) & (ulong)dVar1 |
                      (ulong)dVar7 & -(ulong)(dVar1 <= dVar7));
    }
  }
  if (dVar6 <= dVar5) {
    if (1.23432101234321e+308 <= ABS(dVar6)) {
      return false;
    }
    if (ABS(dVar5) < 1.23432101234321e+308) {
      this->m_t[0] = dVar6;
      this->m_t[1] = dVar5;
      return true;
    }
    return false;
  }
  return false;
}

Assistant:

bool ON_Interval::Union(
  int count,
  const double* t
  )
{
  bool rc = false;
  double a, mn, mx;

  if ( 0 != t )
  {
    while ( count > 0 && !ON_IsValid(*t) )
    {
      count--;
      t++;
    }
  }

  if ( count <= 0 || 0 == t )
  {
    // this may be increasing, decreasing, or empty
    if ( !IsEmptyInterval() )
    {
      mn = Min();
      mx = Max();
      if ( mn <= mx && ON_IsValid(mn) && ON_IsValid(mx) )
      {
        Set( mn, mx );
        rc = true;
      }
    }
  }
  else 
  {
    if ( IsEmptyInterval() ) 
    {
      a = *t++;
      Set( a, a );
      count--;
      rc = true;
    }
    mn = Min();
    mx = Max();
    while( count > 0 )
    {
      count--;
      a = *t++;
      if ( ON_IsValid(a) )
      {
        if ( a < mn )
          mn = a;
        else if ( a > mx )
          mx = a;
      }
    }
    if ( mn <= mx && ON_IsValid(mn) && ON_IsValid(mx) )
    {
      Set(mn,mx);
      rc = true;
    }
    else
    {
      *this = ON_Interval::EmptyInterval;
    }
  }
  return rc;
}